

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5SeekCursor(Fts5Cursor *pCsr,int bErrormsg)

{
  sqlite3_vtab *psVar1;
  sqlite3_stmt *pStmt;
  int iVar2;
  i64 iValue;
  char **local_48;
  int eStmt;
  Fts5FullTable *pTab;
  int rc;
  int bErrormsg_local;
  Fts5Cursor *pCsr_local;
  
  pTab._0_4_ = 0;
  if (pCsr->pStmt == (sqlite3_stmt *)0x0) {
    psVar1 = (pCsr->base).pVtab;
    iVar2 = fts5StmtType(pCsr);
    if (bErrormsg == 0) {
      local_48 = (char **)0x0;
    }
    else {
      local_48 = &psVar1->zErrMsg;
    }
    pTab._0_4_ = sqlite3Fts5StorageStmt
                           ((Fts5Storage *)psVar1[1].zErrMsg,iVar2,&pCsr->pStmt,local_48);
  }
  if (((int)pTab == 0) && ((pCsr->csrflags & 2U) != 0)) {
    sqlite3_reset(pCsr->pStmt);
    pStmt = pCsr->pStmt;
    iValue = fts5CursorRowid(pCsr);
    sqlite3_bind_int64(pStmt,1,iValue);
    iVar2 = sqlite3_step(pCsr->pStmt);
    if (iVar2 == 100) {
      pTab._0_4_ = 0;
      pCsr->csrflags = pCsr->csrflags & 0xfffffffd;
    }
    else {
      pTab._0_4_ = sqlite3_reset(pCsr->pStmt);
      if ((int)pTab == 0) {
        pTab._0_4_ = 0x10b;
      }
    }
  }
  return (int)pTab;
}

Assistant:

static int fts5SeekCursor(Fts5Cursor *pCsr, int bErrormsg){
  int rc = SQLITE_OK;

  /* If the cursor does not yet have a statement handle, obtain one now. */ 
  if( pCsr->pStmt==0 ){
    Fts5FullTable *pTab = (Fts5FullTable*)(pCsr->base.pVtab);
    int eStmt = fts5StmtType(pCsr);
    rc = sqlite3Fts5StorageStmt(
        pTab->pStorage, eStmt, &pCsr->pStmt, (bErrormsg?&pTab->p.base.zErrMsg:0)
    );
    assert( rc!=SQLITE_OK || pTab->p.base.zErrMsg==0 );
    assert( CsrFlagTest(pCsr, FTS5CSR_REQUIRE_CONTENT) );
  }

  if( rc==SQLITE_OK && CsrFlagTest(pCsr, FTS5CSR_REQUIRE_CONTENT) ){
    assert( pCsr->pExpr );
    sqlite3_reset(pCsr->pStmt);
    sqlite3_bind_int64(pCsr->pStmt, 1, fts5CursorRowid(pCsr));
    rc = sqlite3_step(pCsr->pStmt);
    if( rc==SQLITE_ROW ){
      rc = SQLITE_OK;
      CsrFlagClear(pCsr, FTS5CSR_REQUIRE_CONTENT);
    }else{
      rc = sqlite3_reset(pCsr->pStmt);
      if( rc==SQLITE_OK ){
        rc = FTS5_CORRUPT;
      }
    }
  }
  return rc;
}